

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int trex_list(TRex *exp)

{
  int iVar1;
  int iVar2;
  int tright;
  int temp;
  int e;
  int ret;
  TRex *exp_local;
  
  temp = -1;
  if (*exp->_p == '^') {
    exp->_p = exp->_p + 1;
    temp = trex_newnode(exp,0x10b);
  }
  iVar1 = trex_element(exp);
  if (temp != -1) {
    exp->_nodes[temp].next = iVar1;
    iVar1 = temp;
  }
  temp = iVar1;
  if (*exp->_p == '|') {
    exp->_p = exp->_p + 1;
    iVar1 = trex_newnode(exp,0x101);
    exp->_nodes[iVar1].left = temp;
    iVar2 = trex_list(exp);
    exp->_nodes[iVar1].right = iVar2;
    temp = iVar1;
  }
  return temp;
}

Assistant:

static int trex_list(TRex* exp) {
    int ret = -1, e;
    if (*exp->_p == TREX_SYMBOL_BEGINNING_OF_STRING) {
        exp->_p++;
        ret = trex_newnode(exp, OP_BOL);
    }
    e = trex_element(exp);
    if (ret != -1) {
        exp->_nodes[ret].next = e;
    } else
        ret = e;

    if (*exp->_p == TREX_SYMBOL_BRANCH) {
        int temp, tright;
        exp->_p++;
        temp = trex_newnode(exp, OP_OR);
        exp->_nodes[temp].left = ret;
        tright = trex_list(exp);
        exp->_nodes[temp].right = tright;
        ret = temp;
    }
    return ret;
}